

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

void __thiscall
cmELFInternalImpl<cmELFTypes64>::ByteSwap
          (cmELFInternalImpl<cmELFTypes64> *this,ELF_Shdr *sec_header)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [11];
  undefined1 auVar53 [15];
  undefined1 auVar54 [11];
  undefined1 auVar55 [15];
  undefined1 auVar56 [11];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [11];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [11];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar70 [11];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar66 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  
  auVar74._0_4_ = sec_header->sh_name;
  auVar74._4_4_ = sec_header->sh_type;
  auVar74._8_8_ = sec_header->sh_flags;
  auVar78._0_8_ = sec_header->sh_addr;
  auVar78._8_8_ = sec_header->sh_offset;
  auVar1._0_8_ = sec_header->sh_size;
  auVar1._8_4_ = sec_header->sh_link;
  auVar1._12_4_ = sec_header->sh_info;
  auVar2._0_8_ = sec_header->sh_addralign;
  auVar2._8_8_ = sec_header->sh_entsize;
  auVar19[0xd] = 0;
  auVar19._0_13_ = auVar74._0_13_;
  auVar19[0xe] = (char)((uint)auVar74._4_4_ >> 0x18);
  auVar23[0xc] = (char)((uint)auVar74._4_4_ >> 0x10);
  auVar23._0_12_ = auVar74._0_12_;
  auVar23._13_2_ = auVar19._13_2_;
  auVar27[0xb] = 0;
  auVar27._0_11_ = auVar74._0_11_;
  auVar27._12_3_ = auVar23._12_3_;
  auVar31[10] = (char)((uint)auVar74._4_4_ >> 8);
  auVar31._0_10_ = auVar74._0_10_;
  auVar31._11_4_ = auVar27._11_4_;
  auVar35[9] = 0;
  auVar35._0_9_ = auVar74._0_9_;
  auVar35._10_5_ = auVar31._10_5_;
  auVar39[8] = (char)auVar74._4_4_;
  auVar39._0_8_ = auVar74._0_8_;
  auVar39._9_6_ = auVar35._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar39._8_7_;
  auVar57._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar57[0] = (char)((uint)auVar74._0_4_ >> 0x18);
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = (char)((uint)auVar74._0_4_ >> 0x10);
  auVar58._11_4_ = 0;
  auVar43[2] = (char)((uint)auVar74._0_4_ >> 8);
  auVar43._0_2_ = (ushort)auVar74._0_4_;
  auVar43._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar79._0_2_ = (ushort)auVar74._0_4_ & 0xff;
  auVar79._2_13_ = auVar43._2_13_;
  auVar79[0xf] = 0;
  auVar80 = pshuflw(auVar79,auVar79,0x1b);
  auVar80 = pshufhw(auVar80,auVar80,0x1b);
  auVar73[8] = (byte)auVar74._8_8_;
  auVar73[9] = 0;
  auVar73[10] = (char)((ulong)auVar74._8_8_ >> 8);
  auVar69._0_10_ = (unkuint10)(byte)((ulong)auVar74._8_8_ >> 0x20) << 0x40;
  auVar69[10] = (char)((ulong)auVar74._8_8_ >> 0x28);
  auVar71[0xb] = 0;
  auVar71._0_11_ = auVar69;
  auVar71[0xc] = (char)((ulong)auVar74._8_8_ >> 0x30);
  auVar71[0xd] = 0;
  auVar71[0xe] = (char)((ulong)auVar74._8_8_ >> 0x38);
  auVar73[3] = 0;
  auVar73._0_3_ = auVar69._8_3_;
  auVar73._4_3_ = auVar71._12_3_;
  auVar73[7] = 0;
  auVar73[0xb] = 0;
  auVar73._12_3_ =
       (int3)(CONCAT16((char)((ulong)auVar74._8_8_ >> 0x18),
                       (uint6)(byte)((ulong)auVar74._8_8_ >> 0x10) << 0x20) >> 0x20);
  auVar73[0xf] = 0;
  auVar74 = pshuflw(auVar73,auVar73,0x1b);
  auVar74 = pshufhw(auVar74,auVar74,0x1b);
  sVar3 = auVar80._0_2_;
  sVar4 = auVar80._2_2_;
  sVar5 = auVar80._4_2_;
  sVar6 = auVar80._6_2_;
  sVar7 = auVar80._8_2_;
  sVar8 = auVar80._10_2_;
  sVar9 = auVar80._12_2_;
  sVar10 = auVar80._14_2_;
  sVar11 = auVar74._0_2_;
  sVar12 = auVar74._2_2_;
  sVar13 = auVar74._4_2_;
  sVar14 = auVar74._6_2_;
  sVar15 = auVar74._8_2_;
  sVar16 = auVar74._10_2_;
  sVar17 = auVar74._12_2_;
  sVar18 = auVar74._14_2_;
  *(char *)&sec_header->sh_name = (0 < sVar3) * (sVar3 < 0x100) * auVar80[0] - (0xff < sVar3);
  *(char *)((long)&sec_header->sh_name + 1) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar80[2] - (0xff < sVar4);
  *(char *)((long)&sec_header->sh_name + 2) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar80[4] - (0xff < sVar5);
  *(char *)((long)&sec_header->sh_name + 3) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar80[6] - (0xff < sVar6);
  *(char *)&sec_header->sh_type = (0 < sVar7) * (sVar7 < 0x100) * auVar80[8] - (0xff < sVar7);
  *(char *)((long)&sec_header->sh_type + 1) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar80[10] - (0xff < sVar8);
  *(char *)((long)&sec_header->sh_type + 2) =
       (0 < sVar9) * (sVar9 < 0x100) * auVar80[0xc] - (0xff < sVar9);
  *(char *)((long)&sec_header->sh_type + 3) =
       (0 < sVar10) * (sVar10 < 0x100) * auVar80[0xe] - (0xff < sVar10);
  *(char *)&sec_header->sh_flags = (0 < sVar11) * (sVar11 < 0x100) * auVar74[0] - (0xff < sVar11);
  *(char *)((long)&sec_header->sh_flags + 1) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar74[2] - (0xff < sVar12);
  *(char *)((long)&sec_header->sh_flags + 2) =
       (0 < sVar13) * (sVar13 < 0x100) * auVar74[4] - (0xff < sVar13);
  *(char *)((long)&sec_header->sh_flags + 3) =
       (0 < sVar14) * (sVar14 < 0x100) * auVar74[6] - (0xff < sVar14);
  *(char *)((long)&sec_header->sh_flags + 4) =
       (0 < sVar15) * (sVar15 < 0x100) * auVar74[8] - (0xff < sVar15);
  *(char *)((long)&sec_header->sh_flags + 5) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar74[10] - (0xff < sVar16);
  *(char *)((long)&sec_header->sh_flags + 6) =
       (0 < sVar17) * (sVar17 < 0x100) * auVar74[0xc] - (0xff < sVar17);
  *(char *)((long)&sec_header->sh_flags + 7) =
       (0 < sVar18) * (sVar18 < 0x100) * auVar74[0xe] - (0xff < sVar18);
  auVar75[8] = (byte)auVar78._8_8_;
  auVar75[9] = 0;
  auVar75[10] = (char)((ulong)auVar78._8_8_ >> 8);
  auVar70._0_10_ = (unkuint10)(byte)((ulong)auVar78._8_8_ >> 0x20) << 0x40;
  auVar70[10] = (char)((ulong)auVar78._8_8_ >> 0x28);
  auVar72[0xb] = 0;
  auVar72._0_11_ = auVar70;
  auVar72[0xc] = (char)((ulong)auVar78._8_8_ >> 0x30);
  auVar72[0xd] = 0;
  auVar72[0xe] = (char)((ulong)auVar78._8_8_ >> 0x38);
  auVar75[3] = 0;
  auVar75._0_3_ = auVar70._8_3_;
  auVar75._4_3_ = auVar72._12_3_;
  auVar75[7] = 0;
  auVar75[0xb] = 0;
  auVar75._12_3_ =
       (int3)(CONCAT16((char)((ulong)auVar78._8_8_ >> 0x18),
                       (uint6)(byte)((ulong)auVar78._8_8_ >> 0x10) << 0x20) >> 0x20);
  auVar75[0xf] = 0;
  auVar74 = pshuflw(auVar75,auVar75,0x1b);
  auVar74 = pshufhw(auVar74,auVar74,0x1b);
  auVar20[0xd] = 0;
  auVar20._0_13_ = auVar78._0_13_;
  auVar20[0xe] = (char)((ulong)auVar78._0_8_ >> 0x38);
  auVar24[0xc] = (char)((ulong)auVar78._0_8_ >> 0x30);
  auVar24._0_12_ = auVar78._0_12_;
  auVar24._13_2_ = auVar20._13_2_;
  auVar28[0xb] = 0;
  auVar28._0_11_ = auVar78._0_11_;
  auVar28._12_3_ = auVar24._12_3_;
  auVar32[10] = (char)((ulong)auVar78._0_8_ >> 0x28);
  auVar32._0_10_ = auVar78._0_10_;
  auVar32._11_4_ = auVar28._11_4_;
  auVar36[9] = 0;
  auVar36._0_9_ = auVar78._0_9_;
  auVar36._10_5_ = auVar32._10_5_;
  auVar40[8] = (char)((ulong)auVar78._0_8_ >> 0x20);
  auVar40._0_8_ = auVar78._0_8_;
  auVar40._9_6_ = auVar36._9_6_;
  auVar77[7] = 0;
  auVar77._0_7_ = auVar40._8_7_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar40._8_7_;
  auVar59._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar59[0] = (char)((ulong)auVar78._0_8_ >> 0x18);
  auVar59._9_6_ = 0;
  auVar52._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar52[0] = (char)((ulong)auVar78._0_8_ >> 0x10);
  auVar60._11_4_ = 0;
  auVar60._0_11_ = auVar52;
  auVar44[2] = (char)((ulong)auVar78._0_8_ >> 8);
  auVar44._0_2_ = (ushort)auVar78._0_8_;
  auVar44._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar47._2_13_ = auVar44._2_13_;
  auVar47._0_2_ = (ushort)auVar78._0_8_ & 0xff;
  auVar77._8_4_ = auVar47._0_4_;
  auVar77._12_4_ = auVar52._0_4_;
  auVar78 = pshuflw(auVar77,auVar77,0x1b);
  auVar78 = pshufhw(auVar78,auVar78,0x1b);
  sVar3 = auVar78._0_2_;
  sVar4 = auVar78._2_2_;
  sVar5 = auVar78._4_2_;
  sVar6 = auVar78._6_2_;
  sVar7 = auVar78._8_2_;
  sVar8 = auVar78._10_2_;
  sVar9 = auVar78._12_2_;
  sVar10 = auVar78._14_2_;
  sVar11 = auVar74._0_2_;
  sVar12 = auVar74._2_2_;
  sVar13 = auVar74._4_2_;
  sVar14 = auVar74._6_2_;
  sVar15 = auVar74._8_2_;
  sVar16 = auVar74._10_2_;
  sVar17 = auVar74._12_2_;
  sVar18 = auVar74._14_2_;
  *(char *)&sec_header->sh_addr = (0 < sVar3) * (sVar3 < 0x100) * auVar78[0] - (0xff < sVar3);
  *(char *)((long)&sec_header->sh_addr + 1) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar78[2] - (0xff < sVar4);
  *(char *)((long)&sec_header->sh_addr + 2) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar78[4] - (0xff < sVar5);
  *(char *)((long)&sec_header->sh_addr + 3) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar78[6] - (0xff < sVar6);
  *(char *)((long)&sec_header->sh_addr + 4) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar78[8] - (0xff < sVar7);
  *(char *)((long)&sec_header->sh_addr + 5) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar78[10] - (0xff < sVar8);
  *(char *)((long)&sec_header->sh_addr + 6) =
       (0 < sVar9) * (sVar9 < 0x100) * auVar78[0xc] - (0xff < sVar9);
  *(char *)((long)&sec_header->sh_addr + 7) =
       (0 < sVar10) * (sVar10 < 0x100) * auVar78[0xe] - (0xff < sVar10);
  *(char *)&sec_header->sh_offset = (0 < sVar11) * (sVar11 < 0x100) * auVar74[0] - (0xff < sVar11);
  *(char *)((long)&sec_header->sh_offset + 1) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar74[2] - (0xff < sVar12);
  *(char *)((long)&sec_header->sh_offset + 2) =
       (0 < sVar13) * (sVar13 < 0x100) * auVar74[4] - (0xff < sVar13);
  *(char *)((long)&sec_header->sh_offset + 3) =
       (0 < sVar14) * (sVar14 < 0x100) * auVar74[6] - (0xff < sVar14);
  *(char *)((long)&sec_header->sh_offset + 4) =
       (0 < sVar15) * (sVar15 < 0x100) * auVar74[8] - (0xff < sVar15);
  *(char *)((long)&sec_header->sh_offset + 5) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar74[10] - (0xff < sVar16);
  *(char *)((long)&sec_header->sh_offset + 6) =
       (0 < sVar17) * (sVar17 < 0x100) * auVar74[0xc] - (0xff < sVar17);
  *(char *)((long)&sec_header->sh_offset + 7) =
       (0 < sVar18) * (sVar18 < 0x100) * auVar74[0xe] - (0xff < sVar18);
  auVar76[1] = 0;
  auVar76[0] = (byte)auVar1._8_4_;
  auVar76[2] = (char)((uint)auVar1._8_4_ >> 8);
  auVar76[3] = 0;
  auVar76[4] = (char)((uint)auVar1._8_4_ >> 0x10);
  auVar76[5] = 0;
  auVar76[6] = (char)((uint)auVar1._8_4_ >> 0x18);
  auVar76[7] = 0;
  auVar76[8] = (char)auVar1._12_4_;
  auVar76[9] = 0;
  auVar76[10] = (char)((uint)auVar1._12_4_ >> 8);
  auVar76[0xb] = 0;
  auVar76[0xc] = (char)((uint)auVar1._12_4_ >> 0x10);
  auVar76[0xd] = 0;
  auVar76[0xe] = (char)((uint)auVar1._12_4_ >> 0x18);
  auVar76[0xf] = 0;
  auVar74 = pshuflw(auVar76,auVar76,0x1b);
  auVar78 = pshufhw(auVar74,auVar74,0x1b);
  auVar21[0xd] = 0;
  auVar21._0_13_ = auVar1._0_13_;
  auVar21[0xe] = (char)((ulong)auVar1._0_8_ >> 0x38);
  auVar25[0xc] = (char)((ulong)auVar1._0_8_ >> 0x30);
  auVar25._0_12_ = auVar1._0_12_;
  auVar25._13_2_ = auVar21._13_2_;
  auVar29[0xb] = 0;
  auVar29._0_11_ = auVar1._0_11_;
  auVar29._12_3_ = auVar25._12_3_;
  auVar33[10] = (char)((ulong)auVar1._0_8_ >> 0x28);
  auVar33._0_10_ = auVar1._0_10_;
  auVar33._11_4_ = auVar29._11_4_;
  auVar37[9] = 0;
  auVar37._0_9_ = auVar1._0_9_;
  auVar37._10_5_ = auVar33._10_5_;
  auVar41[8] = (char)((ulong)auVar1._0_8_ >> 0x20);
  auVar41._0_8_ = auVar1._0_8_;
  auVar41._9_6_ = auVar37._9_6_;
  auVar67[7] = 0;
  auVar67._0_7_ = auVar41._8_7_;
  auVar53._7_8_ = 0;
  auVar53._0_7_ = auVar41._8_7_;
  auVar61._1_8_ = SUB158(auVar53 << 0x40,7);
  auVar61[0] = (char)((ulong)auVar1._0_8_ >> 0x18);
  auVar61._9_6_ = 0;
  auVar54._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar54[0] = (char)((ulong)auVar1._0_8_ >> 0x10);
  auVar62._11_4_ = 0;
  auVar62._0_11_ = auVar54;
  auVar45[2] = (char)((ulong)auVar1._0_8_ >> 8);
  auVar45._0_2_ = (ushort)auVar1._0_8_;
  auVar45._3_12_ = SUB1512(auVar62 << 0x20,3);
  auVar48._2_13_ = auVar45._2_13_;
  auVar48._0_2_ = (ushort)auVar1._0_8_ & 0xff;
  auVar67._8_4_ = auVar48._0_4_;
  auVar67._12_4_ = auVar54._0_4_;
  auVar74 = pshuflw(auVar67,auVar67,0x1b);
  auVar74 = pshufhw(auVar74,auVar74,0x1b);
  sVar3 = auVar74._0_2_;
  sVar4 = auVar74._2_2_;
  sVar5 = auVar74._4_2_;
  sVar6 = auVar74._6_2_;
  sVar7 = auVar74._8_2_;
  sVar8 = auVar74._10_2_;
  sVar9 = auVar74._12_2_;
  sVar10 = auVar74._14_2_;
  sVar11 = auVar78._0_2_;
  sVar12 = auVar78._2_2_;
  sVar13 = auVar78._4_2_;
  sVar14 = auVar78._6_2_;
  sVar15 = auVar78._8_2_;
  sVar16 = auVar78._10_2_;
  sVar17 = auVar78._12_2_;
  sVar18 = auVar78._14_2_;
  *(char *)&sec_header->sh_size = (0 < sVar3) * (sVar3 < 0x100) * auVar74[0] - (0xff < sVar3);
  *(char *)((long)&sec_header->sh_size + 1) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar74[2] - (0xff < sVar4);
  *(char *)((long)&sec_header->sh_size + 2) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar74[4] - (0xff < sVar5);
  *(char *)((long)&sec_header->sh_size + 3) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar74[6] - (0xff < sVar6);
  *(char *)((long)&sec_header->sh_size + 4) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar74[8] - (0xff < sVar7);
  *(char *)((long)&sec_header->sh_size + 5) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar74[10] - (0xff < sVar8);
  *(char *)((long)&sec_header->sh_size + 6) =
       (0 < sVar9) * (sVar9 < 0x100) * auVar74[0xc] - (0xff < sVar9);
  *(char *)((long)&sec_header->sh_size + 7) =
       (0 < sVar10) * (sVar10 < 0x100) * auVar74[0xe] - (0xff < sVar10);
  *(char *)&sec_header->sh_link = (0 < sVar11) * (sVar11 < 0x100) * auVar78[0] - (0xff < sVar11);
  *(char *)((long)&sec_header->sh_link + 1) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar78[2] - (0xff < sVar12);
  *(char *)((long)&sec_header->sh_link + 2) =
       (0 < sVar13) * (sVar13 < 0x100) * auVar78[4] - (0xff < sVar13);
  *(char *)((long)&sec_header->sh_link + 3) =
       (0 < sVar14) * (sVar14 < 0x100) * auVar78[6] - (0xff < sVar14);
  *(char *)&sec_header->sh_info = (0 < sVar15) * (sVar15 < 0x100) * auVar78[8] - (0xff < sVar15);
  *(char *)((long)&sec_header->sh_info + 1) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar78[10] - (0xff < sVar16);
  *(char *)((long)&sec_header->sh_info + 2) =
       (0 < sVar17) * (sVar17 < 0x100) * auVar78[0xc] - (0xff < sVar17);
  *(char *)((long)&sec_header->sh_info + 3) =
       (0 < sVar18) * (sVar18 < 0x100) * auVar78[0xe] - (0xff < sVar18);
  auVar68[8] = (byte)auVar2._8_8_;
  auVar68[9] = 0;
  auVar68[10] = (char)((ulong)auVar2._8_8_ >> 8);
  auVar65._0_10_ = (unkuint10)(byte)((ulong)auVar2._8_8_ >> 0x20) << 0x40;
  auVar65[10] = (char)((ulong)auVar2._8_8_ >> 0x28);
  auVar66[0xb] = 0;
  auVar66._0_11_ = auVar65;
  auVar66[0xc] = (char)((ulong)auVar2._8_8_ >> 0x30);
  auVar66[0xd] = 0;
  auVar66[0xe] = (char)((ulong)auVar2._8_8_ >> 0x38);
  auVar68[3] = 0;
  auVar68._0_3_ = auVar65._8_3_;
  auVar68._4_3_ = auVar66._12_3_;
  auVar68[7] = 0;
  auVar68[0xb] = 0;
  auVar68._12_3_ =
       (int3)(CONCAT16((char)((ulong)auVar2._8_8_ >> 0x18),
                       (uint6)(byte)((ulong)auVar2._8_8_ >> 0x10) << 0x20) >> 0x20);
  auVar68[0xf] = 0;
  auVar74 = pshuflw(auVar68,auVar68,0x1b);
  auVar78 = pshufhw(auVar74,auVar74,0x1b);
  auVar22[0xd] = 0;
  auVar22._0_13_ = auVar2._0_13_;
  auVar22[0xe] = (char)((ulong)auVar2._0_8_ >> 0x38);
  auVar26[0xc] = (char)((ulong)auVar2._0_8_ >> 0x30);
  auVar26._0_12_ = auVar2._0_12_;
  auVar26._13_2_ = auVar22._13_2_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar2._0_11_;
  auVar30._12_3_ = auVar26._12_3_;
  auVar34[10] = (char)((ulong)auVar2._0_8_ >> 0x28);
  auVar34._0_10_ = auVar2._0_10_;
  auVar34._11_4_ = auVar30._11_4_;
  auVar38[9] = 0;
  auVar38._0_9_ = auVar2._0_9_;
  auVar38._10_5_ = auVar34._10_5_;
  auVar42[8] = (char)((ulong)auVar2._0_8_ >> 0x20);
  auVar42._0_8_ = auVar2._0_8_;
  auVar42._9_6_ = auVar38._9_6_;
  auVar80[7] = 0;
  auVar80._0_7_ = auVar42._8_7_;
  auVar55._7_8_ = 0;
  auVar55._0_7_ = auVar42._8_7_;
  auVar63._1_8_ = SUB158(auVar55 << 0x40,7);
  auVar63[0] = (char)((ulong)auVar2._0_8_ >> 0x18);
  auVar63._9_6_ = 0;
  auVar56._1_10_ = SUB1510(auVar63 << 0x30,5);
  auVar56[0] = (char)((ulong)auVar2._0_8_ >> 0x10);
  auVar64._11_4_ = 0;
  auVar64._0_11_ = auVar56;
  auVar46[2] = (char)((ulong)auVar2._0_8_ >> 8);
  auVar46._0_2_ = (ushort)auVar2._0_8_;
  auVar46._3_12_ = SUB1512(auVar64 << 0x20,3);
  auVar49._2_13_ = auVar46._2_13_;
  auVar49._0_2_ = (ushort)auVar2._0_8_ & 0xff;
  auVar80._8_4_ = auVar49._0_4_;
  auVar80._12_4_ = auVar56._0_4_;
  auVar74 = pshuflw(auVar80,auVar80,0x1b);
  auVar74 = pshufhw(auVar74,auVar74,0x1b);
  sVar3 = auVar74._0_2_;
  sVar4 = auVar74._2_2_;
  sVar5 = auVar74._4_2_;
  sVar6 = auVar74._6_2_;
  sVar7 = auVar74._8_2_;
  sVar8 = auVar74._10_2_;
  sVar9 = auVar74._12_2_;
  sVar10 = auVar74._14_2_;
  sVar11 = auVar78._0_2_;
  sVar12 = auVar78._2_2_;
  sVar13 = auVar78._4_2_;
  sVar14 = auVar78._6_2_;
  sVar15 = auVar78._8_2_;
  sVar16 = auVar78._10_2_;
  sVar17 = auVar78._12_2_;
  sVar18 = auVar78._14_2_;
  *(char *)&sec_header->sh_addralign = (0 < sVar3) * (sVar3 < 0x100) * auVar74[0] - (0xff < sVar3);
  *(char *)((long)&sec_header->sh_addralign + 1) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar74[2] - (0xff < sVar4);
  *(char *)((long)&sec_header->sh_addralign + 2) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar74[4] - (0xff < sVar5);
  *(char *)((long)&sec_header->sh_addralign + 3) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar74[6] - (0xff < sVar6);
  *(char *)((long)&sec_header->sh_addralign + 4) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar74[8] - (0xff < sVar7);
  *(char *)((long)&sec_header->sh_addralign + 5) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar74[10] - (0xff < sVar8);
  *(char *)((long)&sec_header->sh_addralign + 6) =
       (0 < sVar9) * (sVar9 < 0x100) * auVar74[0xc] - (0xff < sVar9);
  *(char *)((long)&sec_header->sh_addralign + 7) =
       (0 < sVar10) * (sVar10 < 0x100) * auVar74[0xe] - (0xff < sVar10);
  *(char *)&sec_header->sh_entsize = (0 < sVar11) * (sVar11 < 0x100) * auVar78[0] - (0xff < sVar11);
  *(char *)((long)&sec_header->sh_entsize + 1) =
       (0 < sVar12) * (sVar12 < 0x100) * auVar78[2] - (0xff < sVar12);
  *(char *)((long)&sec_header->sh_entsize + 2) =
       (0 < sVar13) * (sVar13 < 0x100) * auVar78[4] - (0xff < sVar13);
  *(char *)((long)&sec_header->sh_entsize + 3) =
       (0 < sVar14) * (sVar14 < 0x100) * auVar78[6] - (0xff < sVar14);
  *(char *)((long)&sec_header->sh_entsize + 4) =
       (0 < sVar15) * (sVar15 < 0x100) * auVar78[8] - (0xff < sVar15);
  *(char *)((long)&sec_header->sh_entsize + 5) =
       (0 < sVar16) * (sVar16 < 0x100) * auVar78[10] - (0xff < sVar16);
  *(char *)((long)&sec_header->sh_entsize + 6) =
       (0 < sVar17) * (sVar17 < 0x100) * auVar78[0xc] - (0xff < sVar17);
  *(char *)((long)&sec_header->sh_entsize + 7) =
       (0 < sVar18) * (sVar18 < 0x100) * auVar78[0xe] - (0xff < sVar18);
  return;
}

Assistant:

static void cmELFByteSwap(char* data, cmELFByteSwapSize<4> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[3];
  data[3] = one_byte;
  one_byte = data[1];
  data[1] = data[2];
  data[2] = one_byte;
}